

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectInterfacePerModuleSource.cpp
# Opt level: O2

string * __thiscall
PerModuleInterface::GetOSCanonicalCleanPath_abi_cxx11_
          (string *__return_storage_ptr__,PerModuleInterface *this,char *compilePath_,
          char *filename_)

{
  Path path;
  Path local_90;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Path local_40;
  
  local_68 = (undefined1  [8])&PTR__Path_0011aa10;
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&local_60);
  FileSystemUtils::Path::Path(&local_40,compilePath_);
  FileSystemUtils::operator/(&local_90,(Path *)local_68,&local_40);
  std::__cxx11::string::_M_assign((string *)&local_60);
  FileSystemUtils::Path::~Path(&local_90);
  FileSystemUtils::Path::~Path(&local_40);
  FileSystemUtils::Path::DelimitersToOSDefault(&local_90,(Path *)local_68);
  std::__cxx11::string::_M_assign((string *)&local_60);
  FileSystemUtils::Path::~Path(&local_90);
  FileSystemUtils::Path::GetCleanPath(&local_90,(Path *)local_68);
  std::__cxx11::string::_M_assign((string *)&local_60);
  FileSystemUtils::Path::~Path(&local_90);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_60);
  FileSystemUtils::Path::~Path((Path *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string PerModuleInterface::GetOSCanonicalCleanPath( const char* compilePath_, const char* filename_ )
{
	FileSystemUtils::Path path;
	path = compilePath_;
	path = path / filename_;
	path = path.DelimitersToOSDefault();
	path = path.GetCleanPath();
	path.ToOSCanonicalCase();
	return path.m_string;
}